

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<std::complex<double>_>::SolveSOR
          (TPZSkylMatrix<std::complex<double>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<double>_> *F,TPZFMatrix<std::complex<double>_> *result,
          TPZFMatrix<std::complex<double>_> *residual,TPZFMatrix<std::complex<double>_> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  complex<double> **ppcVar1;
  complex<double> *pcVar2;
  undefined1 auVar3 [16];
  int iVar4;
  undefined4 extraout_var;
  complex<double> *pcVar5;
  complex<double> *pcVar6;
  complex<double> *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  complex<double> *pcVar11;
  long lVar12;
  bool bVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  double dVar14;
  undefined8 uVar15;
  double local_108;
  undefined8 local_e8;
  double dStack_e0;
  double local_c8;
  double dStack_c0;
  int local_b4;
  undefined1 local_b0 [16];
  long local_a0;
  long local_98;
  long local_90;
  TPZFMatrix<std::complex<double>_> *local_88;
  double *local_80;
  long *local_78;
  long local_70;
  double local_68;
  undefined8 uStack_60;
  TPZFMatrix<std::complex<double>_> *local_50;
  long local_48;
  complex<double> over;
  
  local_88 = F;
  local_78 = numiterations;
  if (residual != F) {
    local_b4 = direction;
    local_80 = tol;
    if (residual == (TPZFMatrix<std::complex<double>_> *)0x0) {
      local_108 = *tol + *tol + 1.0;
    }
    else {
      local_108 = Norm(residual);
    }
    local_50 = residual;
    if (FromCurrent == 0) {
      (*(result->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0xf])();
    }
    over._M_value._8_8_ = 0;
    over._M_value._0_8_ = overrelax;
    iVar4 = (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])();
    local_48 = (local_88->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol;
    local_a0 = CONCAT44(extraout_var,iVar4) + -1;
    lVar8 = 0;
    local_98 = (ulong)(local_b4 != -1) * 2 + -1;
    lVar12 = lVar8;
    if (local_b4 != -1) {
      local_a0 = lVar8;
      lVar12 = CONCAT44(extraout_var,iVar4);
    }
    if (local_48 < 1) {
      local_48 = lVar8;
    }
    local_90 = lVar12;
    while ((lVar8 < *local_78 && (*local_80 <= local_108 && local_108 != *local_80))) {
      local_70 = lVar8;
      TPZFMatrix<std::complex<double>_>::operator=(scratch,local_88);
      local_108 = 0.0;
      for (lVar8 = 0; lVar8 != local_48; lVar8 = lVar8 + 1) {
        lVar9 = local_a0;
        if (local_b4 == 1) {
          for (; lVar10 = local_a0, lVar9 != lVar12; lVar9 = lVar9 + local_98) {
            ppcVar1 = (this->fElem).fStore;
            pcVar11 = ppcVar1[lVar9 + 1];
            pcVar2 = ppcVar1[lVar9];
            local_c8 = 0.0;
            dStack_c0 = 0.0;
            pcVar7 = ppcVar1[lVar9];
            pcVar5 = TPZFMatrix<std::complex<double>_>::operator()
                               (scratch,(lVar9 - ((long)pcVar11 - (long)pcVar2 >> 4)) + 1,lVar8);
            pcVar6 = TPZFMatrix<std::complex<double>_>::operator()(result,lVar9,lVar8);
            local_c8 = *(double *)pcVar6->_M_value;
            dStack_c0 = *(double *)(pcVar6->_M_value + 8);
            pcVar11 = (complex<double> *)
                      ((long)(this->fElem).fStore[lVar9] + ((long)pcVar11 - (long)pcVar2) + -0x10);
            lVar12 = (long)pcVar11 - (long)pcVar7 >> 4;
            if (lVar12 < 0) {
              lVar12 = -1;
            }
            lVar12 = lVar12 + 1;
            while (bVar13 = lVar12 != 0, lVar12 = lVar12 + -1, bVar13) {
              std::operator*(pcVar11,(complex<double> *)&local_c8);
              dVar14 = *(double *)(pcVar5->_M_value + 8);
              *(double *)pcVar5->_M_value =
                   *(double *)pcVar5->_M_value - (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da)
              ;
              *(double *)(pcVar5->_M_value + 8) = dVar14 - overrelax;
              pcVar11 = pcVar11 + -1;
              pcVar5 = pcVar5 + 1;
            }
            lVar12 = local_90;
          }
          for (; lVar10 != lVar12; lVar10 = lVar10 + local_98) {
            ppcVar1 = (this->fElem).fStore;
            lVar12 = (long)ppcVar1[lVar10 + 1] - (long)ppcVar1[lVar10];
            pcVar11 = TPZFMatrix<std::complex<double>_>::operator()(scratch,lVar10,lVar8);
            local_c8 = *(double *)pcVar11->_M_value;
            dStack_c0 = *(double *)(pcVar11->_M_value + 8);
            pcVar7 = TPZFMatrix<std::complex<double>_>::operator()
                               (result,(lVar10 - (lVar12 >> 4)) + 1,lVar8);
            pcVar2 = (this->fElem).fStore[lVar10];
            pcVar11 = (complex<double> *)(lVar12 + (long)pcVar2);
            while (pcVar11 = pcVar11 + -1, pcVar2 < pcVar11) {
              std::operator*(pcVar11,pcVar7);
              local_c8 = local_c8 - (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
              dStack_c0 = dStack_c0 - overrelax;
              pcVar7 = pcVar7 + 1;
            }
            std::operator*((complex<double> *)&local_c8,(complex<double> *)&local_c8);
            local_b0._8_8_ = overrelax;
            dVar14 = std::abs<double>((complex<double> *)local_b0);
            uVar15 = 0;
            local_108 = local_108 + dVar14;
            dVar14 = local_108;
            std::operator*((complex<double> *)&local_c8,&over);
            local_b0._8_8_ = dVar14;
            std::operator/((complex<double> *)local_b0,pcVar11);
            local_e8 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
            local_68 = dVar14;
            uStack_60 = uVar15;
            pcVar11 = TPZFMatrix<std::complex<double>_>::operator()(result,lVar10,lVar8);
            dVar14 = *(double *)(pcVar11->_M_value + 8);
            overrelax = local_e8 + *(double *)pcVar11->_M_value;
            *(REAL *)pcVar11->_M_value = overrelax;
            *(double *)(pcVar11->_M_value + 8) = local_68 + dVar14;
            lVar12 = local_90;
          }
        }
        else {
          for (; lVar10 = local_a0, lVar9 != lVar12; lVar9 = lVar9 + local_98) {
            ppcVar1 = (this->fElem).fStore;
            lVar12 = (long)ppcVar1[lVar9 + 1] - (long)ppcVar1[lVar9];
            pcVar11 = TPZFMatrix<std::complex<double>_>::operator()(scratch,lVar9,lVar8);
            local_e8 = *(double *)pcVar11->_M_value;
            dStack_e0 = *(double *)(pcVar11->_M_value + 8);
            pcVar7 = TPZFMatrix<std::complex<double>_>::operator()
                               (result,(lVar9 - (lVar12 >> 4)) + 1,lVar8);
            pcVar2 = (this->fElem).fStore[lVar9];
            pcVar11 = (complex<double> *)(lVar12 + (long)pcVar2);
            while (pcVar11 = pcVar11 + -1, pcVar2 < pcVar11) {
              std::operator*(pcVar11,pcVar7);
              local_e8 = local_e8 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
              dStack_e0 = dStack_e0 - overrelax;
              pcVar7 = pcVar7 + 1;
              overrelax = local_e8;
            }
            pcVar11 = TPZFMatrix<std::complex<double>_>::operator()(scratch,lVar9,lVar8);
            *(double *)pcVar11->_M_value = local_e8;
            *(double *)(pcVar11->_M_value + 8) = dStack_e0;
            lVar12 = local_90;
          }
          for (; lVar10 != lVar12; lVar10 = lVar10 + local_98) {
            ppcVar1 = (this->fElem).fStore;
            pcVar2 = ppcVar1[lVar10];
            lVar12 = (long)ppcVar1[lVar10 + 1] - (long)pcVar2;
            pcVar7 = TPZFMatrix<std::complex<double>_>::operator()
                               (scratch,(lVar10 - (lVar12 >> 4)) + 1,lVar8);
            pcVar11 = TPZFMatrix<std::complex<double>_>::operator()(scratch,lVar10,lVar8);
            local_c8 = *(double *)pcVar11->_M_value;
            dStack_c0 = *(double *)(pcVar11->_M_value + 8);
            pcVar11 = TPZFMatrix<std::complex<double>_>::operator()(result,lVar10,lVar8);
            std::operator*(pcVar2,pcVar11);
            local_c8 = local_c8 - (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
            dStack_c0 = dStack_c0 - overrelax;
            std::operator*((complex<double> *)&local_c8,(complex<double> *)&local_c8);
            local_b0._8_8_ = overrelax;
            local_68 = std::abs<double>((complex<double> *)local_b0);
            std::operator*(&over,(complex<double> *)&local_c8);
            local_b0._8_8_ = overrelax;
            std::operator/((complex<double> *)local_b0,pcVar2);
            local_c8 = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
            dStack_c0 = overrelax;
            pcVar11 = TPZFMatrix<std::complex<double>_>::operator()(result,lVar10,lVar8);
            dVar14 = *(double *)(pcVar11->_M_value + 8) + dStack_c0;
            auVar3._8_4_ = SUB84(dVar14,0);
            auVar3._0_8_ = *(double *)pcVar11->_M_value + local_c8;
            auVar3._12_4_ = (int)((ulong)dVar14 >> 0x20);
            *(undefined1 (*) [16])pcVar11->_M_value = auVar3;
            pcVar11 = TPZFMatrix<std::complex<double>_>::operator()(result,lVar10,lVar8);
            local_c8 = *(double *)pcVar11->_M_value;
            dStack_c0 = *(double *)(pcVar11->_M_value + 8);
            pcVar11 = (complex<double> *)((long)(this->fElem).fStore[lVar10] + lVar12);
            while (pcVar11 = pcVar11 + -1, pcVar2 < pcVar11) {
              std::operator*(pcVar11,(complex<double> *)&local_c8);
              dVar14 = *(double *)(pcVar7->_M_value + 8);
              *(double *)pcVar7->_M_value =
                   *(double *)pcVar7->_M_value -
                   (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
              *(double *)(pcVar7->_M_value + 8) = dVar14 - overrelax;
              pcVar7 = pcVar7 + 1;
            }
            local_108 = local_108 + local_68;
            lVar12 = local_90;
          }
        }
      }
      if (local_108 < 0.0) {
        local_108 = sqrt(local_108);
      }
      else {
        local_108 = SQRT(local_108);
      }
      lVar8 = local_70 + 1;
    }
    if (local_50 != (TPZFMatrix<std::complex<double>_> *)0x0) {
      (*(this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x28])(this,result,local_88);
    }
    *local_78 = lVar8;
    *local_80 = local_108;
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "TPZMatrix::SolveSOR called with residual and F equal, no solution\n");
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}